

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::trackerid_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,trackerid_alert *this)

{
  char *__rhs;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  trackerid_alert *local_18;
  trackerid_alert *this_local;
  
  local_18 = this;
  this_local = (trackerid_alert *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"trackerid received: ",&local_39);
  __rhs = tracker_id(this);
  std::operator+(__return_storage_ptr__,&local_38,__rhs);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string trackerid_alert::message() const
	{
		return std::string("trackerid received: ") + tracker_id();
	}